

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O1

vector<unsigned_long,_true> *
duckdb::ExpressionHeuristics::GetInitialOrder
          (vector<unsigned_long,_true> *__return_storage_ptr__,TableFilterSet *table_filters)

{
  iterator __position;
  unsigned_long *puVar1;
  type filter;
  idx_t iVar2;
  unsigned_long *__dest;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  ulong uVar5;
  __normal_iterator<FilterCost_*,_std::vector<FilterCost,_std::allocator<FilterCost>_>_> __i;
  unsigned_long *puVar6;
  _Rb_tree_header *p_Var7;
  unsigned_long uVar8;
  size_t __n;
  unsigned_long *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  unsigned_long *local_48;
  
  p_Var3 = (table_filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(table_filters->filters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var7) {
    puVar9 = (unsigned_long *)0x0;
    __dest = (unsigned_long *)0x0;
  }
  else {
    uVar8 = 0;
    puVar9 = (unsigned_long *)0x0;
    local_48 = (unsigned_long *)0x0;
    puVar6 = (unsigned_long *)0x0;
    do {
      filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&p_Var3[1]._M_parent);
      iVar2 = Cost(filter);
      if (puVar9 == local_48) {
        __n = (long)puVar9 - (long)puVar6;
        if (__n == 0x7ffffffffffffff0) {
          ::std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = (long)__n >> 4;
        uVar4 = 1;
        if (puVar9 != puVar6) {
          uVar4 = uVar10;
        }
        uVar5 = uVar4 + uVar10;
        if (0x7fffffffffffffe < uVar5) {
          uVar5 = 0x7ffffffffffffff;
        }
        uVar11 = 0x7ffffffffffffff;
        if (!CARRY8(uVar4,uVar10)) {
          uVar11 = uVar5;
        }
        if (uVar11 == 0) {
          __dest = (unsigned_long *)0x0;
        }
        else {
          __dest = (unsigned_long *)operator_new(uVar11 << 4);
        }
        __dest[uVar10 * 2] = uVar8;
        __dest[uVar10 * 2 + 1] = iVar2;
        if (0 < (long)__n) {
          memmove(__dest,puVar6,__n);
        }
        if (puVar6 != (unsigned_long *)0x0) {
          operator_delete(puVar6);
        }
        puVar9 = (unsigned_long *)(__n + (long)__dest);
        local_48 = __dest + uVar11 * 2;
      }
      else {
        *puVar9 = uVar8;
        puVar9[1] = iVar2;
        __dest = puVar6;
      }
      puVar9 = puVar9 + 2;
      uVar8 = uVar8 + 1;
      p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
      puVar6 = __dest;
    } while ((_Rb_tree_header *)p_Var3 != p_Var7);
  }
  if (__dest != puVar9) {
    uVar4 = (long)puVar9 - (long)__dest >> 4;
    lVar12 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (__dest,puVar9,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)puVar9 - (long)__dest < 0x101) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (__dest,puVar9);
    }
    else {
      puVar6 = __dest + 0x20;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (__dest,puVar6);
      for (; puVar6 != puVar9; puVar6 = puVar6 + 2) {
        uVar8 = *puVar6;
        uVar4 = puVar6[1];
        uVar10 = puVar6[-1];
        puVar1 = puVar6;
        while (uVar4 < uVar10) {
          *(int *)puVar1 = (int)puVar1[-2];
          *(undefined4 *)((long)puVar1 + 4) = *(undefined4 *)((long)puVar1 + -0xc);
          *(int *)(puVar1 + 1) = (int)puVar1[-1];
          *(undefined4 *)((long)puVar1 + 0xc) = *(undefined4 *)((long)puVar1 + -4);
          uVar10 = puVar1[-3];
          puVar1 = puVar1 + -2;
        }
        *puVar1 = uVar8;
        puVar1[1] = uVar4;
      }
    }
  }
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((long)puVar9 - (long)__dest != 0) {
    lVar12 = (long)puVar9 - (long)__dest >> 4;
    lVar12 = lVar12 + (ulong)(lVar12 == 0);
    puVar9 = __dest;
    do {
      __position._M_current =
           (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   __position,puVar9);
      }
      else {
        *__position._M_current = *puVar9;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      puVar9 = puVar9 + 2;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  if (__dest != (unsigned_long *)0x0) {
    operator_delete(__dest);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> ExpressionHeuristics::GetInitialOrder(const TableFilterSet &table_filters) {
	struct FilterCost {
		idx_t index;
		idx_t cost;

		bool operator==(const FilterCost &p) const {
			return cost == p.cost;
		}
		bool operator<(const FilterCost &p) const {
			return cost < p.cost;
		}
	};
	vector<FilterCost> filter_costs;
	idx_t filter_index = 0;
	for (auto &entry : table_filters.filters) {
		FilterCost cost;
		cost.index = filter_index;
		cost.cost = Cost(*entry.second);
		filter_costs.push_back(cost);
		filter_index++;
	}
	// sort by cost and put back in place
	sort(filter_costs.begin(), filter_costs.end());
	vector<idx_t> initial_permutation;
	for (idx_t i = 0; i < filter_costs.size(); i++) {
		initial_permutation.push_back(filter_costs[i].index);
	}
	return initial_permutation;
}